

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,string *lhs,uint32_t rhs_id,StorageClass param_3,StorageClass param_4)

{
  string sStack_38;
  
  to_expression_abi_cxx11_(&sStack_38,this,rhs_id,true);
  statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,lhs,(char (*) [4])0x31e8c7,&sStack_38,(char (*) [2])0x304bae);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void CompilerGLSL::emit_array_copy(const string &lhs, uint32_t rhs_id, StorageClass, StorageClass)
{
	statement(lhs, " = ", to_expression(rhs_id), ";");
}